

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall
Hospital::Validate_Doctor_To_Enter
          (Hospital *this,string *username,string *password,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors)

{
  pointer pDVar1;
  __type _Var2;
  ostream *poVar3;
  string *this_00;
  ulong uVar4;
  long lVar5;
  string username_1;
  string local_50;
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    pDVar1 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl
                       .super__Vector_impl_data._M_finish - (long)pDVar1) / 0x178) <= uVar4) {
      poVar3 = std::operator<<((ostream *)&std::cout,"your username or password is incorrect .");
      std::endl<char,std::char_traits<char>>(poVar3);
      return false;
    }
    Human::User_name_Getter_abi_cxx11_
              (&username_1,(Human *)((long)&(pDVar1->super_Human).Id._M_dataplus + lVar5));
    _Var2 = std::operator==(&username_1,username);
    if (_Var2) {
      Human::Password_Getter_abi_cxx11_
                (&local_50,
                 (Human *)((long)&(((All_Of_Doctors->
                                    super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
                                    super__Vector_impl_data._M_start)->super_Human).Id._M_dataplus +
                          lVar5));
      _Var2 = std::operator==(&local_50,password);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&username_1);
      if (_Var2) {
        this_00 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string(this_00,(string *)username);
        __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    else {
      std::__cxx11::string::~string((string *)&username_1);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x178;
  } while( true );
}

Assistant:

bool Hospital :: Validate_Doctor_To_Enter (string username , string password , vector<Doctor> All_Of_Doctors){
    int cntr = 0;

    for (int i = 0; i < All_Of_Doctors.size(); ++i) {
        if (All_Of_Doctors[i].User_name_Getter() == username && All_Of_Doctors[i].Password_Getter() == password) {
            cntr++;
            break;
        }
    }

    try {
        if (cntr == 0) {
            cout << "your username or password is incorrect ." << endl;
            return false;
        } else throw username;
    }
    catch (string username) {
        cout << "you entered successfully ." << endl;
        return true;
    }
}